

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O0

void __thiscall Analizer::Analizer(Analizer *this)

{
  Analizer *this_local;
  
  acto::actor::actor(&this->super_actor);
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__Analizer_0012a770;
  std::vector<acto::actor_ref,_std::allocator<acto::actor_ref>_>::vector(&this->m_listeners);
  acto::actor::handler<msg_complete,Analizer,msg_complete_const&>(&this->super_actor,0x104b60);
  acto::actor::handler<msg_start,Analizer,msg_start_const&>(&this->super_actor,0x104c70);
  acto::actor::handler<msg_stop,Analizer,msg_stop_const&>(&this->super_actor,0x104e10);
  return;
}

Assistant:

Analizer() {
    handler< msg_complete >(&Analizer::doComplete);

    handler< msg_start >   (&Analizer::doStart);
    handler< msg_stop  >   (&Analizer::doStop);
  }